

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

bool xmrig::Json::getBool(Value *obj,char *key,bool defaultValue)

{
  ushort uVar1;
  ConstMemberIterator CVar2;
  undefined1 uVar3;
  
  CVar2 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember(obj,key);
  uVar3 = defaultValue;
  if ((CVar2.ptr_ !=
       (Pointer)((ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff))
      ) && (uVar1 = ((CVar2.ptr_)->value).data_.f.flags, uVar3 = uVar1 == 10, (uVar1 & 8) == 0)) {
    uVar3 = defaultValue;
  }
  return (bool)uVar3;
}

Assistant:

bool xmrig::Json::getBool(const rapidjson::Value &obj, const char *key, bool defaultValue)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsBool()) {
        return i->value.GetBool();
    }

    return defaultValue;
}